

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execShiftRg<(moira::Instr)13,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  uint uVar2;
  u32 uVar3;
  uint uVar4;
  ushort in_SI;
  long *in_RDI;
  int cnt;
  int dst;
  int src;
  u32 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  uint cnt_00;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar1 = (int)(uint)in_SI >> 9 & 7;
  uVar2 = in_SI & 7;
  uVar3 = readD<(moira::Size)4>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  uVar4 = uVar3 & 0x3f;
  prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (**(code **)(*in_RDI + 200))(in_RDI,uVar4 * 2 + 4);
  cnt_00 = uVar2;
  readD<(moira::Size)4>
            ((Moira *)(CONCAT44(uVar3,in_stack_ffffffffffffffd0) & 0x3fffffffff),
             in_stack_ffffffffffffffcc);
  shift<(moira::Instr)13,(moira::Size)4>
            ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar1)),cnt_00,
             CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  writeD<(moira::Size)4>
            ((Moira *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void
Moira::execShiftRg(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = readD(src) & 0x3F;

    prefetch<POLLIPL>();
    sync((S == Long ? 4 : 2) + 2 * cnt);

    writeD<S>(dst, shift<I,S>(cnt, readD<S>(dst)));
}